

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestScriptHandler.cxx
# Opt level: O2

bool cmCTestScriptHandler::TryToRemoveBinaryDirectoryOnce(string *directoryPath)

{
  bool bVar1;
  Kind KVar2;
  unsigned_long uVar3;
  char *__s;
  ulong dindex;
  Directory directory;
  string fullPath;
  string path;
  Directory local_e0;
  string *local_d8;
  string local_d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b0;
  cmAlphaNum local_90;
  cmAlphaNum local_60;
  Status SVar4;
  
  cmsys::Directory::Directory(&local_e0);
  local_d8 = directoryPath;
  cmsys::Directory::Load(&local_e0,directoryPath,(string *)0x0);
  dindex = 0;
  do {
    uVar3 = cmsys::Directory::GetNumberOfFiles(&local_e0);
    if (uVar3 <= dindex) {
      SVar4 = cmsys::SystemTools::RemoveADirectory(local_d8);
      bVar1 = SVar4.Kind_ == Success;
LAB_001ba88c:
      cmsys::Directory::~Directory(&local_e0);
      return bVar1;
    }
    __s = cmsys::Directory::GetFile(&local_e0,dindex);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_b0,__s,(allocator<char> *)&local_60);
    bVar1 = std::operator==(&local_b0,".");
    if (!bVar1) {
      bVar1 = std::operator==(&local_b0,"..");
      if (!bVar1) {
        bVar1 = std::operator==(&local_b0,"CMakeCache.txt");
        if (!bVar1) {
          local_60.View_._M_str = (local_d8->_M_dataplus)._M_p;
          local_60.View_._M_len = local_d8->_M_string_length;
          local_90.View_._M_len = 1;
          local_90.View_._M_str = "/";
          cmStrCat<std::__cxx11::string>(&local_d0,&local_60,&local_90,&local_b0);
          bVar1 = cmsys::SystemTools::FileIsDirectory(&local_d0);
          if (bVar1) {
            bVar1 = cmsys::SystemTools::FileIsSymlink(&local_d0);
            if (bVar1) goto LAB_001ba849;
            SVar4 = cmsys::SystemTools::RemoveADirectory(&local_d0);
            KVar2 = SVar4.Kind_;
          }
          else {
LAB_001ba849:
            SVar4 = cmsys::SystemTools::RemoveFile(&local_d0);
            KVar2 = SVar4.Kind_;
          }
          if (KVar2 != Success) {
            std::__cxx11::string::~string((string *)&local_d0);
            std::__cxx11::string::~string((string *)&local_b0);
            bVar1 = false;
            goto LAB_001ba88c;
          }
          std::__cxx11::string::~string((string *)&local_d0);
        }
      }
    }
    std::__cxx11::string::~string((string *)&local_b0);
    dindex = dindex + 1;
  } while( true );
}

Assistant:

bool cmCTestScriptHandler::TryToRemoveBinaryDirectoryOnce(
  const std::string& directoryPath)
{
  cmsys::Directory directory;
  directory.Load(directoryPath);

  for (unsigned long i = 0; i < directory.GetNumberOfFiles(); ++i) {
    std::string path = directory.GetFile(i);

    if (path == "." || path == ".." || path == "CMakeCache.txt") {
      continue;
    }

    std::string fullPath = cmStrCat(directoryPath, "/", path);

    bool isDirectory = cmSystemTools::FileIsDirectory(fullPath) &&
      !cmSystemTools::FileIsSymlink(fullPath);

    if (isDirectory) {
      if (!cmSystemTools::RemoveADirectory(fullPath)) {
        return false;
      }
    } else {
      if (!cmSystemTools::RemoveFile(fullPath)) {
        return false;
      }
    }
  }

  return static_cast<bool>(cmSystemTools::RemoveADirectory(directoryPath));
}